

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompiler.cpp
# Opt level: O1

bool __thiscall
Diligent::anon_unknown_0::DXCompilerImpl::RemapResourceBindings
          (DXCompilerImpl *this,TResourceBindingMap *ResourceMap,IDxcBlob *pSrcBytecode,
          IDxcBlob **ppDstByteCode)

{
  return false;
}

Assistant:

bool DXCompilerImpl::RemapResourceBindings(const TResourceBindingMap& ResourceMap,
                                           IDxcBlob*                  pSrcBytecode,
                                           IDxcBlob**                 ppDstByteCode)
{
    // NOTE: a reference to pSrcBytecode may be kept in the returned object

#if D3D12_SUPPORTED
    try
    {
        DxcCreateInstanceProc CreateInstance = m_Library.GetDxcCreateInstance();
        if (CreateInstance == nullptr)
        {
            LOG_ERROR("Failed to load DXCompiler");
            return false;
        }

        CComPtr<IDxcLibrary> pdxcLibrary;
        CHECK_D3D_RESULT(CreateInstance(CLSID_DxcLibrary, IID_PPV_ARGS(&pdxcLibrary)), "Failed to create DXC Library");

        CComPtr<IDxcAssembler> pdxcAssembler;
        CHECK_D3D_RESULT(CreateInstance(CLSID_DxcAssembler, IID_PPV_ARGS(&pdxcAssembler)), "Failed to create DXC assembler");

        CComPtr<IDxcCompiler> pdxcCompiler;
        CHECK_D3D_RESULT(CreateInstance(CLSID_DxcCompiler, IID_PPV_ARGS(&pdxcCompiler)), "Failed to create DXC Compiler");

        CComPtr<IDxcBlobEncoding> pdxcDisasm;
        CHECK_D3D_RESULT(pdxcCompiler->Disassemble(pSrcBytecode, &pdxcDisasm), "Failed to disassemble bytecode");

        CComPtr<ID3D12ShaderReflection> pd3d12Reflection;
        GetD3D12ShaderReflection(pSrcBytecode, &pd3d12Reflection);
        if (!pd3d12Reflection)
            LOG_ERROR_AND_THROW("Failed to get D3D12 shader reflection from shader bytecode");

        SHADER_TYPE ShaderType = SHADER_TYPE_UNKNOWN;
        {
            D3D12_SHADER_DESC ShDesc = {};
            pd3d12Reflection->GetDesc(&ShDesc);

            const Uint32 ShType = D3D12_SHVER_GET_TYPE(ShDesc.Version);
            switch (ShType)
            {
                    // clang-format off
                case D3D12_SHVER_PIXEL_SHADER:    ShaderType = SHADER_TYPE_PIXEL;            break;
                case D3D12_SHVER_VERTEX_SHADER:   ShaderType = SHADER_TYPE_VERTEX;           break;
                case D3D12_SHVER_GEOMETRY_SHADER: ShaderType = SHADER_TYPE_GEOMETRY;         break;
                case D3D12_SHVER_HULL_SHADER:     ShaderType = SHADER_TYPE_HULL;             break;
                case D3D12_SHVER_DOMAIN_SHADER:   ShaderType = SHADER_TYPE_DOMAIN;           break;
                case D3D12_SHVER_COMPUTE_SHADER:  ShaderType = SHADER_TYPE_COMPUTE;          break;
                case 7:                           ShaderType = SHADER_TYPE_RAY_GEN;          break;
                case 8:                           ShaderType = SHADER_TYPE_RAY_INTERSECTION; break;
                case 9:                           ShaderType = SHADER_TYPE_RAY_ANY_HIT;      break;
                case 10:                          ShaderType = SHADER_TYPE_RAY_CLOSEST_HIT;  break;
                case 11:                          ShaderType = SHADER_TYPE_RAY_MISS;         break;
                case 12:                          ShaderType = SHADER_TYPE_CALLABLE;         break;
                case 13:                          ShaderType = SHADER_TYPE_MESH;             break;
                case 14:                          ShaderType = SHADER_TYPE_AMPLIFICATION;    break;
                // clang-format on
                default:
                    UNEXPECTED("Unknown shader type");
            }
        }

        TExtendedResourceMap ExtResourceMap;

        for (const auto& NameAndBinding : ResourceMap)
        {
            D3D12_SHADER_INPUT_BIND_DESC ResDesc = {};
            if (pd3d12Reflection->GetResourceBindingDescByName(NameAndBinding.first.GetStr(), &ResDesc) == S_OK)
            {
                ResourceExtendedInfo& Ext = ExtResourceMap[&NameAndBinding];
                Ext.SrcBindPoint          = ResDesc.BindPoint;
                Ext.SrcArraySize          = ResDesc.BindCount;
                Ext.SrcSpace              = ResDesc.Space;

#    ifdef NO_D3D_SIT_ACCELSTRUCT_FEEDBACK_TEX
                switch (int{ResDesc.Type}) // Prevent "not a valid value for switch of enum '_D3D_SHADER_INPUT_TYPE'" warning
#    else
                switch (ResDesc.Type)
#    endif
                {
                    case D3D_SIT_CBUFFER:
                        Ext.Type = RES_TYPE_CBV;
                        break;
                    case D3D_SIT_SAMPLER:
                        Ext.Type = RES_TYPE_SAMPLER;
                        break;
                    case D3D_SIT_TBUFFER:
                    case D3D_SIT_TEXTURE:
                    case D3D_SIT_STRUCTURED:
                    case D3D_SIT_BYTEADDRESS:
                    case D3D_SIT_RTACCELERATIONSTRUCTURE:
                        Ext.Type = RES_TYPE_SRV;
                        break;
                    case D3D_SIT_UAV_RWTYPED:
                    case D3D_SIT_UAV_RWSTRUCTURED:
                    case D3D_SIT_UAV_RWBYTEADDRESS:
                    case D3D_SIT_UAV_APPEND_STRUCTURED:
                    case D3D_SIT_UAV_CONSUME_STRUCTURED:
                    case D3D_SIT_UAV_RWSTRUCTURED_WITH_COUNTER:
                    case D3D_SIT_UAV_FEEDBACKTEXTURE:
                        Ext.Type = RES_TYPE_UAV;
                        break;
                    default:
                        LOG_ERROR("Unknown shader resource type");
                        return false;
                }

#    ifdef DILIGENT_DEVELOPMENT
                {
                    static_assert(SHADER_RESOURCE_TYPE_LAST == 8, "Please update the switch below to handle the new shader resource type");
                    RES_TYPE ExpectedResType = RES_TYPE_COUNT;
                    switch (NameAndBinding.second.ResType)
                    {
                            // clang-format off
                        case SHADER_RESOURCE_TYPE_CONSTANT_BUFFER:  ExpectedResType = RES_TYPE_CBV;     break;
                        case SHADER_RESOURCE_TYPE_TEXTURE_SRV:      ExpectedResType = RES_TYPE_SRV;     break;
                        case SHADER_RESOURCE_TYPE_BUFFER_SRV:       ExpectedResType = RES_TYPE_SRV;     break;
                        case SHADER_RESOURCE_TYPE_TEXTURE_UAV:      ExpectedResType = RES_TYPE_UAV;     break;
                        case SHADER_RESOURCE_TYPE_BUFFER_UAV:       ExpectedResType = RES_TYPE_UAV;     break;
                        case SHADER_RESOURCE_TYPE_SAMPLER:          ExpectedResType = RES_TYPE_SAMPLER; break;
                        case SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT: ExpectedResType = RES_TYPE_SRV;     break;
                        case SHADER_RESOURCE_TYPE_ACCEL_STRUCT:     ExpectedResType = RES_TYPE_SRV;     break;
                        // clang-format on
                        default: UNEXPECTED("Unsupported shader resource type.");
                    }
                    DEV_CHECK_ERR(Ext.Type == ExpectedResType,
                                  "There is a mismatch between the type of resource '", NameAndBinding.first.GetStr(),
                                  "' expected by the client and the actual resource type.");
                }
#    endif

                // For some reason
                //      Texture2D g_Textures[]
                // produces BindCount == 0, but
                //      ConstantBuffer<CBData> g_ConstantBuffers[]
                // produces BindCount == UINT_MAX
                VERIFY_EXPR((Ext.Type != RES_TYPE_CBV && ResDesc.BindCount == 0) ||
                            (Ext.Type == RES_TYPE_CBV && ResDesc.BindCount == UINT_MAX) ||
                            NameAndBinding.second.ArraySize >= ResDesc.BindCount);
            }
        }

        String dxilAsm{static_cast<const char*>(pdxcDisasm->GetBufferPointer()), pdxcDisasm->GetBufferSize()};

        if (!PatchDXIL(ResourceMap, ExtResourceMap, ShaderType, dxilAsm))
        {
            LOG_ERROR_AND_THROW("Failed to patch resource bindings");
            return false;
        }

        CComPtr<IDxcBlobEncoding> pPatchedDisasm;
        CHECK_D3D_RESULT(pdxcLibrary->CreateBlobWithEncodingFromPinned(dxilAsm.data(), static_cast<UINT32>(dxilAsm.size()), 0, &pPatchedDisasm), "Failed to create patched disassemble blob");

        CComPtr<IDxcOperationResult> pdxcResult;
        CHECK_D3D_RESULT(pdxcAssembler->AssembleToContainer(pPatchedDisasm, &pdxcResult), "Failed to assemble patched disassembly");

        HRESULT status = E_FAIL;
        pdxcResult->GetStatus(&status);

        if (FAILED(status))
        {
            CComPtr<IDxcBlobEncoding> pErrorsBlob;
            CComPtr<IDxcBlobEncoding> pErrorsBlobUtf8;
            if (SUCCEEDED(pdxcResult->GetErrorBuffer(&pErrorsBlob)) && SUCCEEDED(pdxcLibrary->GetBlobAsUtf8(pErrorsBlob, &pErrorsBlobUtf8)))
            {
                String errorLog{static_cast<const char*>(pErrorsBlobUtf8->GetBufferPointer()), pErrorsBlobUtf8->GetBufferSize()};
                LOG_ERROR_AND_THROW("Failed to compile patched assembly: ", errorLog);
            }
            else
                LOG_ERROR_AND_THROW("Failed to compile patched assembly");

            return false;
        }

        CComPtr<IDxcBlob> pCompiledBlob;
        CHECK_D3D_RESULT(pdxcResult->GetResult(static_cast<IDxcBlob**>(&pCompiledBlob)), "Failed to get compiled blob from DXC result");

        return ValidateAndSign(CreateInstance, pdxcLibrary, pCompiledBlob, ppDstByteCode);
    }
    catch (...)
    {
        return false;
    }
#else
    return false;
#endif // D3D12_SUPPORTED
}